

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_4_P::ComputeKRMmatricesGlobal
          (ChElementTetraCorot_4_P *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor
          )

{
  undefined1 auVar1 [16];
  Scalar *pSVar2;
  int id;
  long row;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double local_58;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_50;
  
  local_58 = Kfactor;
  if (((H->
       super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
       .
       super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 4) &&
     ((H->
      super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
      .
      super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 4)) {
    Eigen::operator*(&local_50,&local_58,(StorageBaseType *)&this->StiffnessMatrix);
    Eigen::internal::
    call_assignment<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
              (H,&local_50);
    if ((Rfactor != 0.0) || (NAN(Rfactor))) {
      std::__shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_50,
                 &(this->Material).
                  super___shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2>)
      ;
      dVar3 = (double)(**(code **)(*(long *)local_50._0_8_ + 0x20))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.m_lhs);
      if ((dVar3 != 0.0) || (NAN(dVar3))) {
        dVar3 = this->Volume;
        std::__shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr((__shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2> *)
                     &local_50,
                     &(this->Material).
                      super___shared_ptr<chrono::fea::ChContinuumPoisson3D,_(__gnu_cxx::_Lock_policy)2>
                    );
        dVar4 = (double)(**(code **)(*(long *)local_50._0_8_ + 0x20))();
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_50.m_lhs);
        row = 0;
        while (row != 4) {
          pSVar2 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)H,row,row);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *pSVar2;
          auVar6._8_8_ = 0;
          auVar6._0_8_ = dVar4 * dVar3 * 0.25;
          row = row + 1;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = Rfactor;
          auVar1 = vfmadd231sd_fma(auVar5,auVar6,auVar1);
          *pSVar2 = auVar1._0_8_;
        }
      }
    }
    return;
  }
  __assert_fail("(H.rows() == 4) && (H.cols() == 4)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementTetraCorot_4.cpp"
                ,0x1dd,
                "virtual void chrono::fea::ChElementTetraCorot_4_P::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementTetraCorot_4_P::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 4) && (H.cols() == 4));

    // For K  matrix (jacobian d/dT of  c dT/dt + div [C] grad T = f )
    H = Kfactor * StiffnessMatrix;

    // For R  matrix: (jacobian d/d\dot(T) of  c dT/dt + div [C] grad T = f )
    if (Rfactor)
        if (this->GetMaterial()->Get_DtMultiplier()) {
            // lumped approx. integration of c
            double lumped_node_c = (this->GetVolume() * this->GetMaterial()->Get_DtMultiplier()) / 4.0;
            for (int id = 0; id < 4; id++) {
                H(id, id) += Rfactor * lumped_node_c;
            }
        }
    //***TO DO*** better per-node lumping, or 4x4 consistent c integration as per mass matrices.

    // For M mass matrix: NONE in Poisson equation c dT/dt + div [C] grad T = f
}